

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error.c
# Opt level: O0

int run_test_tcp_connect_error_fault(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_1b0 [8];
  uv_connect_t req;
  undefined1 local_148 [4];
  int r;
  uv_tcp_t server;
  sockaddr_in *garbage_addr;
  char garbage [60];
  
  memcpy(&garbage_addr,"blah blah blah blah blah blah blah blah blah blah blah blah",0x3c);
  server.queued_fds = &garbage_addr;
  uVar2 = uv_default_loop();
  req.queue[1]._4_4_ = uv_tcp_init(uVar2,local_148);
  if (req.queue[1]._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-error.c"
            ,0x39,"r == 0");
    abort();
  }
  req.queue[1]._4_4_ = uv_tcp_connect(local_1b0,local_148,server.queued_fds,connect_cb);
  if (req.queue[1]._4_4_ != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-error.c"
            ,0x3e,"r == UV_EINVAL");
    abort();
  }
  uv_close(local_148,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (connect_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-error.c"
            ,0x44,"connect_cb_called == 0");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-error.c"
            ,0x45,"close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-error.c"
            ,0x47,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_connect_error_fault) {
  const char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  const struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;
  uv_connect_t req;

  garbage_addr = (const struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_connect(&req,
                     &server,
                     (const struct sockaddr*) garbage_addr,
                     connect_cb);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}